

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O1

w_status wp_token_scan_binary_int(w_tokenizer *tokenizer,w_token_id *id)

{
  w_status wVar1;
  byte *pbVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *msg;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe2);
  }
  if (tokenizer->it == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe3);
  }
  if (tokenizer->it[-2] != '0') {
    w_handle_failed_assertion
              ("tokenizer->it[-2] == \'0\'","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe4);
  }
  if (tokenizer->it[-1] != 'b') {
    w_handle_failed_assertion
              ("tokenizer->it[-1] == \'b\'","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe5);
  }
  if (id == (w_token_id *)0x0) {
    w_handle_failed_assertion
              ("id != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe6);
  }
  uVar4 = (ulong)(byte)*tokenizer->it;
  if (uVar4 < 0x32) {
    if ((0xac0100000401U >> (uVar4 & 0x3f) & 1) != 0) {
      msg = "unterminated binary integer literal";
      goto LAB_001074f3;
    }
    if ((0x3000000000000U >> (uVar4 & 0x3f) & 1) != 0) {
      tokenizer->column = tokenizer->column + 1;
      tokenizer->it = tokenizer->it + 1;
      if (tokenizer == (w_tokenizer *)0x0) {
        w_handle_failed_assertion
                  ("tokenizer != NULL","wp_token_consume_binary_digits",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
                   ,0xa3);
      }
      if (tokenizer->it == (char *)0x0) {
        w_handle_failed_assertion
                  ("tokenizer->it != NULL","wp_token_consume_binary_digits",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
                   ,0xa4);
      }
      pbVar2 = (byte *)tokenizer->it;
      if ((*pbVar2 & 0xfe) == 0x30) {
        uVar3 = tokenizer->column;
        do {
          uVar3 = uVar3 + 1;
          pbVar2 = pbVar2 + 1;
          tokenizer->it = (char *)pbVar2;
          tokenizer->column = uVar3;
        } while ((*pbVar2 & 0xfe) == 0x30);
      }
      if (((ulong)(byte)*tokenizer->it < 0x30) &&
         ((0xac0100000401U >> ((ulong)(byte)*tokenizer->it & 0x3f) & 1) != 0)) {
        *id = W_TOKEN_ID_INT_BINARY;
        return W_SUCCESS;
      }
    }
  }
  msg = "not a valid binary integer literal character";
LAB_001074f3:
  wVar1 = wp_token_add_error(tokenizer,msg);
  return wVar1;
}

Assistant:

static enum w_status
wp_token_scan_binary_int(
    struct w_tokenizer *tokenizer,
    enum w_token_id *id
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);
    W_ASSERT(tokenizer->it[-2] == '0');
    W_ASSERT(tokenizer->it[-1] == 'b');
    W_ASSERT(id != NULL);

    switch (*tokenizer->it)
    {
        case WP_TOKEN_CASE_BINARY_DIGITS:
        {
            wp_token_advance_iter(tokenizer);
            wp_token_consume_binary_digits(tokenizer);
            switch (*tokenizer->it)
            {
                case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
                {
                    *id = W_TOKEN_ID_INT_BINARY;
                    return W_SUCCESS;
                }
                default:
                {
                    return wp_token_add_error(
                        tokenizer,
                        WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR(
                            "binary integer literal"
                        )
                    );
                }
            }
        }
        case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_UNTERMINATED("binary integer literal")
            );
        }
        default:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR("binary integer literal")
            );
        }
    }
}